

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.c
# Opt level: O0

fec_t * fec_new(uint k,uint n)

{
  long lVar1;
  gf *b;
  uint uVar2;
  uint uVar3;
  gf *pgVar4;
  int n_00;
  gf *a;
  undefined8 uStack_50;
  gf *local_48;
  uint local_3c;
  gf *pgStack_38;
  uint row;
  gf *p;
  ulong uStack_28;
  uint col;
  unsigned_long __vla_expr0;
  fec_t *local_18;
  fec_t *res;
  uint n_local;
  uint k_local;
  
  res._0_4_ = n;
  res._4_4_ = k;
  if (fec_new::gf_initialized == 0) {
    uStack_50 = 0x1090d1;
    gf_init();
    fec_new::gf_initialized = 1;
  }
  uStack_50 = 0x1090e5;
  local_18 = (fec_t *)malloc(0x10);
  if (local_18 == (fec_t *)0x0) {
    uStack_50 = 0x109111;
    __assert_fail("res != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",0x30,
                  "fec_t *fec_new(unsigned int, unsigned int)");
  }
  uStack_50 = 0x109126;
  pgVar4 = (gf *)malloc((ulong)res._4_4_ * (ulong)(uint)res);
  local_18->gen_matrix = pgVar4;
  if (local_18->gen_matrix == (gf *)0x0) {
    uStack_50 = 0x10915d;
    __assert_fail("res->gen_matrix != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",0x32,
                  "fec_t *fec_new(unsigned int, unsigned int)");
  }
  local_18->k = res._4_4_;
  local_18->n = (uint)res;
  uStack_28 = (ulong)(res._4_4_ * (uint)res);
  lVar1 = -(uStack_28 + 0xf & 0xfffffffffffffff0);
  local_48 = (gf *)((long)&local_48 + lVar1);
  __vla_expr0 = (unsigned_long)&local_48;
  *local_48 = '\x01';
  uVar2 = res._4_4_;
  pgVar4 = local_48;
  for (p._4_4_ = 1; p._4_4_ < res._4_4_; p._4_4_ = p._4_4_ + 1) {
    local_48[p._4_4_] = '\0';
  }
  pgStack_38 = local_48 + res._4_4_;
  for (local_3c = 0; local_3c < (uint)res - 1; local_3c = local_3c + 1) {
    for (p._4_4_ = 0; p._4_4_ < res._4_4_; p._4_4_ = p._4_4_ + 1) {
      pgStack_38[p._4_4_] = gf_polys[(ulong)(local_3c * p._4_4_) % 0xff];
    }
    pgStack_38 = pgStack_38 + res._4_4_;
  }
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x109253;
  matrix_inv_vandermonde(pgVar4,uVar2);
  uVar2 = res._4_4_;
  b = local_48;
  a = local_48 + res._4_4_ * res._4_4_;
  pgVar4 = local_18->gen_matrix;
  uVar3 = res._4_4_ * res._4_4_;
  n_00 = (uint)res - res._4_4_;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x10928d;
  matrix_mul(a,b,pgVar4 + uVar3,n_00,uVar2,uVar2);
  for (local_3c = 0; local_3c < res._4_4_; local_3c = local_3c + 1) {
    for (p._4_4_ = 0; p._4_4_ < res._4_4_; p._4_4_ = p._4_4_ + 1) {
      if (p._4_4_ == local_3c) {
        local_18->gen_matrix[local_3c * res._4_4_ + p._4_4_] = '\x01';
      }
      else {
        local_18->gen_matrix[local_3c * res._4_4_ + p._4_4_] = '\0';
      }
    }
  }
  return local_18;
}

Assistant:

fec_t *fec_new(unsigned int k, unsigned int n) {
  assert((k <= n ) || "k is too big");
  assert((k <= 256) || "k is too big");
  assert((n <= 256) || "n is too big");

  /*M
    Init Galois arithmetic if not already initialized.
  **/
  static int gf_initialized = 0;
  if (!gf_initialized) {
    gf_init();
    gf_initialized = 1;
  }

  fec_t *res;
  res = malloc(sizeof(fec_t));
  assert(res != NULL);
  res->gen_matrix = malloc(sizeof(gf)*k*n);
  assert(res->gen_matrix != NULL);

  res->k = k;
  res->n = n;

  /*M
    Fill the matrix with powers of field elements.
  **/
  gf tmp[k*n];
  /*  gf *tmp = res->gen_matrix; */

  /*M
    First row is special (powers of $0$).
  **/
  tmp[0] = 1;
  unsigned int col;
  for (col = 1; col < k; col++)
    tmp[col] = 0;
  
  gf *p;
  unsigned int row;
  for (p = tmp + k, row = 0; row < n - 1; row++, p += k) {
    for (col = 0; col < k; col++)
      p[col] = gf_polys[(row * col) % 255];
  }

#ifdef DEBUG
  fprintf(stderr, "first vandermonde matrix\n");
  matrix_print(tmp, res->n, res->k);
#endif

  /*M
    Invert the upper $k \times k$ vandermonde matrix.
  **/
  matrix_inv_vandermonde(tmp, k);

#ifdef DEBUG
  fprintf(stderr, "\ninverted vandermonde matrix\n");
  matrix_print(tmp, res->n, res->k);
#endif

  /*M
    Multiply the inverted upper $k \times k$ vandermonde matrix with
    the lower band of the matrix.
  **/
  matrix_mul(tmp + k * k, tmp, res->gen_matrix + k * k, n - k, k, k);

  /*M
    Fill the upper $k \times k$ matrix with the identity matrix to
    generate a systematic matrix.
  **/
  for (row = 0; row < k; row++)
    for (col = 0; col < k; col++)
      if (col == row)
        res->gen_matrix[row * k + col] = 1;
      else
        res->gen_matrix[row * k + col] = 0;

#ifdef DEBUG
  fprintf(stderr, "\ngenerated matrix\n");
  matrix_print(res->gen_matrix, res->n, res->k);
#endif
  
  return res;
}